

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Abc_Cex_t * Saig_RefManRunSat(Saig_RefMan_t *p,int fNewOrder)

{
  long lVar1;
  Aig_Obj_t *s;
  int iVar2;
  int iVar3;
  lit Entry_00;
  uint uVar4;
  uint uVar5;
  undefined1 *__s;
  Vec_Int_t *pVVar6;
  int *begin;
  int *piVar7;
  abctime clk;
  int *pCoreLits;
  int local_68;
  int nCoreLits;
  int RetValue;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vVar2PiId;
  Vec_Int_t *vAssumps;
  Vec_Vec_t *vLits;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Abc_Cex_t *pCare;
  int nConfLimit;
  int fNewOrder_local;
  Saig_RefMan_t *p_local;
  
  pCare._0_4_ = 1000000;
  vAssumps = (Vec_Int_t *)0x0;
  pCare._4_4_ = fNewOrder;
  _nConfLimit = p;
  Abc_Clock();
  iVar2 = Aig_ManRegNum(_nConfLimit->pFrames);
  if (iVar2 != 0) {
    __assert_fail("Aig_ManRegNum(p->pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                  ,0x203,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
  }
  pSat = (sat_solver *)Cnf_DeriveSimple(_nConfLimit->pFrames,0);
  local_68 = Saig_RefManSetPhases(_nConfLimit,(Abc_Cex_t *)0x0,0);
  if (local_68 == 0) {
    Cnf_DataTranformPolarity((Cnf_Dat_t *)pSat,0);
    pObj = (Aig_Obj_t *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pSat,1,0);
    if ((sat_solver *)pObj == (sat_solver *)0x0) {
      Cnf_DataFree((Cnf_Dat_t *)pSat);
      p_local = (Saig_RefMan_t *)0x0;
    }
    else if ((_nConfLimit->nInputs < 1) ||
            (local_68 = sat_solver_solve((sat_solver *)pObj,(lit *)0x0,(lit *)0x0,(long)(int)pCare,0
                                         ,0,0), local_68 != -1)) {
      _k = Vec_IntStartFull(pSat->qhead);
      iVar2 = Aig_ManCiNum(_nConfLimit->pFrames);
      vVar2PiId = Vec_IntAlloc(iVar2);
      for (Entry = 0; iVar2 = Entry, iVar3 = Vec_PtrSize(_nConfLimit->pFrames->vCis), iVar2 < iVar3;
          Entry = Entry + 1) {
        vLits = (Vec_Vec_t *)Vec_PtrEntry(_nConfLimit->pFrames->vCis,Entry);
        pVVar6 = vVar2PiId;
        lVar1 = *(long *)(pSat->Mem).BookMarkE;
        iVar2 = Aig_ObjId((Aig_Obj_t *)vLits);
        Entry_00 = toLitCond(*(int *)(lVar1 + (long)iVar2 * 4),1);
        Vec_IntPush(pVVar6,Entry_00);
        pVVar6 = _k;
        lVar1 = *(long *)(pSat->Mem).BookMarkE;
        iVar2 = Aig_ObjId((Aig_Obj_t *)vLits);
        Vec_IntWriteEntry(pVVar6,*(int *)(lVar1 + (long)iVar2 * 4),Entry);
      }
      if (pCare._4_4_ != 0) {
        vAssumps = (Vec_Int_t *)Saig_RefManOrderLiterals(_nConfLimit,_k,vVar2PiId);
        Vec_VecSort((Vec_Vec_t *)vAssumps,1);
        Vec_IntClear(vVar2PiId);
        for (Entry = 0; iVar2 = Entry, iVar3 = Vec_VecSize((Vec_Vec_t *)vAssumps), iVar2 < iVar3;
            Entry = Entry + 1) {
          RetValue = 0;
          while( true ) {
            iVar2 = RetValue;
            pVVar6 = Vec_VecEntryInt((Vec_Vec_t *)vAssumps,Entry);
            iVar3 = Vec_IntSize(pVVar6);
            if (iVar3 <= iVar2) break;
            pVVar6 = Vec_VecEntryInt((Vec_Vec_t *)vAssumps,Entry);
            nCoreLits = Vec_IntEntry(pVVar6,RetValue);
            Vec_IntPush(vVar2PiId,nCoreLits);
            RetValue = RetValue + 1;
          }
        }
        for (Entry = 0; iVar2 = Entry, iVar3 = Vec_VecSize((Vec_Vec_t *)vAssumps), iVar2 < iVar3;
            Entry = Entry + 1) {
          pVVar6 = Vec_VecEntryInt((Vec_Vec_t *)vAssumps,Entry);
          uVar4 = Vec_IntSize(pVVar6);
          printf("%d ",(ulong)uVar4);
        }
        printf("\n");
        if (_nConfLimit->fVerbose != 0) {
          iVar3 = Saig_ManPiNum(_nConfLimit->pAig);
          iVar2 = _nConfLimit->nInputs;
          uVar4 = Vec_VecSize((Vec_Vec_t *)vAssumps);
          printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(iVar3 - iVar2),(ulong)uVar4);
        }
      }
      Abc_Clock();
      s = pObj;
      begin = Vec_IntArray(vVar2PiId);
      piVar7 = Vec_IntArray(vVar2PiId);
      iVar2 = Vec_IntSize(vVar2PiId);
      local_68 = sat_solver_solve((sat_solver *)s,begin,piVar7 + iVar2,(long)(int)pCare,0,0,0);
      if (local_68 == -1) {
        uVar4 = sat_solver_final((sat_solver *)pObj,(int **)&clk);
        pCoreLits._4_4_ = uVar4;
        if ((int)uVar4 < 1) {
          __assert_fail("nCoreLits > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                        ,0x25d,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
        }
        if (_nConfLimit->fVerbose != 0) {
          uVar5 = Vec_IntSize(vVar2PiId);
          printf("AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n",(ulong)uVar4,
                 (ulong)uVar5,(ulong)pObj[9].pFanin0 & 0xffffffff);
        }
        Vec_IntClear(vVar2PiId);
        for (Entry = 0; Entry < (int)pCoreLits._4_4_; Entry = Entry + 1) {
          Vec_IntPush(vVar2PiId,*(int *)(clk + (long)Entry * 4));
        }
        vAssumps = (Vec_Int_t *)Saig_RefManOrderLiterals(_nConfLimit,_k,vVar2PiId);
        Vec_IntClear(vVar2PiId);
        for (Entry = 0; iVar2 = Entry, iVar3 = Vec_VecSize((Vec_Vec_t *)vAssumps), iVar2 < iVar3;
            Entry = Entry + 1) {
          RetValue = 0;
          while( true ) {
            iVar2 = RetValue;
            pVVar6 = Vec_VecEntryInt((Vec_Vec_t *)vAssumps,Entry);
            iVar3 = Vec_IntSize(pVVar6);
            if (iVar3 <= iVar2) break;
            pVVar6 = Vec_VecEntryInt((Vec_Vec_t *)vAssumps,Entry);
            nCoreLits = Vec_IntEntry(pVVar6,RetValue);
            Vec_IntPush(vVar2PiId,nCoreLits);
            RetValue = RetValue + 1;
          }
        }
        if (_nConfLimit->fVerbose != 0) {
          iVar3 = Saig_ManPiNum(_nConfLimit->pAig);
          iVar2 = _nConfLimit->nInputs;
          uVar4 = Vec_VecSize((Vec_Vec_t *)vAssumps);
          printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(iVar3 - iVar2),(ulong)uVar4);
        }
        pCnf = (Cnf_Dat_t *)Saig_RefManCreateCex(_nConfLimit,_k,vVar2PiId);
        Cnf_DataFree((Cnf_Dat_t *)pSat);
        sat_solver_delete((sat_solver *)pObj);
        Vec_IntFree(vVar2PiId);
        Vec_IntFree(_k);
        Vec_VecFreeP((Vec_Vec_t **)&vAssumps);
        local_68 = Saig_RefManSetPhases(_nConfLimit,(Abc_Cex_t *)pCnf,0);
        if (local_68 != 0) {
          printf("Reduced CEX verification has failed.\n");
        }
        local_68 = Saig_RefManSetPhases(_nConfLimit,(Abc_Cex_t *)pCnf,1);
        if (local_68 != 0) {
          printf("Reduced CEX verification has failed.\n");
        }
        p_local = (Saig_RefMan_t *)pCnf;
      }
      else {
        if (local_68 == 1) {
          printf("Internal Error!!! The resulting problem is SAT.\n");
        }
        else {
          printf("Internal Error!!! SAT solver timed out.\n");
        }
        Cnf_DataFree((Cnf_Dat_t *)pSat);
        sat_solver_delete((sat_solver *)pObj);
        Vec_IntFree(vVar2PiId);
        Vec_IntFree(_k);
        p_local = (Saig_RefMan_t *)0x0;
      }
    }
    else {
      printf("The problem is trivially UNSAT. The CEX is real.\n");
      pCnf = (Cnf_Dat_t *)Abc_CexDup(_nConfLimit->pCex,_nConfLimit->pCex->nRegs);
      __s = &pCnf->field_0x14;
      iVar2 = Abc_BitWordNum(pCnf->nClauses);
      memset(__s,0,(long)iVar2 << 2);
      p_local = (Saig_RefMan_t *)pCnf;
    }
  }
  else {
    printf("Constructed frames are incorrect.\n");
    Cnf_DataFree((Cnf_Dat_t *)pSat);
    p_local = (Saig_RefMan_t *)0x0;
  }
  return (Abc_Cex_t *)p_local;
}

Assistant:

Abc_Cex_t * Saig_RefManRunSat( Saig_RefMan_t * p, int fNewOrder )
{
    int nConfLimit = 1000000;
    Abc_Cex_t * pCare;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits = NULL;
    Vec_Int_t * vAssumps, * vVar2PiId;
    int i, k, Entry, RetValue;//, f = 0, Counter = 0;
    int nCoreLits, * pCoreLits;
    abctime clk = Abc_Clock();
    // create CNF
    assert( Aig_ManRegNum(p->pFrames) == 0 );
//    pCnf = Cnf_Derive( p->pFrames, 0 ); // too slow
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    RetValue = Saig_RefManSetPhases( p, NULL, 0 );
    if ( RetValue )
    {
        printf( "Constructed frames are incorrect.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    Cnf_DataTranformPolarity( pCnf, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
//Abc_PrintTime( 1, "Preparing", Abc_Clock() - clk );
    // look for a true counter-example
    if ( p->nInputs > 0 )
    {
        RetValue = sat_solver_solve( pSat, NULL, NULL, 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            printf( "The problem is trivially UNSAT. The CEX is real.\n" );
            // create counter-example
            pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
            memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
            return pCare;
        }
        // the problem is SAT - it is expected
    }
    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
//        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }

    // reverse the order of assumptions
//    if ( fNewOrder )
//    Vec_IntReverseOrder( vAssumps );

    if ( fNewOrder )
    {
        // create literals
        vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
        // sort literals
        Vec_VecSort( vLits, 1 );
        // save literals
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            Vec_IntPush( vAssumps, Entry );

        for ( i = 0; i < Vec_VecSize(vLits); i++ )
            printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
        printf( "\n" );

        if ( p->fVerbose )
            printf( "Total PIs = %d. Essential PIs = %d.\n", 
                Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
    }

    // solve
clk = Abc_Clock();
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//Abc_PrintTime( 1, "Solving", Abc_Clock() - clk );
    if ( RetValue != l_False )
    {
        if ( RetValue == l_True )
            printf( "Internal Error!!! The resulting problem is SAT.\n" );
        else
            printf( "Internal Error!!! SAT solver timed out.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Vec_IntFree( vAssumps );
        Vec_IntFree( vVar2PiId );
        return NULL;
    }
    assert( RetValue == l_False ); // UNSAT

    // get relevant SAT literals
    nCoreLits = sat_solver_final( pSat, &pCoreLits );
    assert( nCoreLits > 0 );
    if ( p->fVerbose )
    printf( "AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n", 
        nCoreLits, Vec_IntSize(vAssumps), (int)pSat->stats.conflicts );

    // save literals
    Vec_IntClear( vAssumps );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( vAssumps, pCoreLits[i] );


    // create literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    // sort literals
//    Vec_VecSort( vLits, 0 );
    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

//    for ( i = 0; i < Vec_VecSize(vLits); i++ )
//        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
//    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
/*
    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );

    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );
*/
    // create counter-example
    pCare = Saig_RefManCreateCex( p, vVar2PiId, vAssumps );

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    // verify counter-example
    RetValue = Saig_RefManSetPhases( p, pCare, 0 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    RetValue = Saig_RefManSetPhases( p, pCare, 1 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    return pCare;
}